

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::BVHNIntersector1<4,_16777232,_true,_embree::avx2::SubdivPatch1MBIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  RTCRayQueryContext *pRVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  undefined1 auVar51 [32];
  int iVar52;
  uint uVar53;
  AABBNodeMB4D *node1;
  ulong uVar54;
  long lVar55;
  Geometry *pGVar56;
  uint uVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  undefined1 (*pauVar61) [16];
  undefined1 auVar62 [8];
  ulong uVar63;
  long lVar64;
  uint uVar65;
  Primitive *prim;
  ulong uVar66;
  undefined1 (*pauVar67) [16];
  undefined1 (*pauVar68) [16];
  ulong uVar69;
  undefined4 uVar70;
  ulong unaff_R14;
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  float fVar78;
  undefined1 auVar74 [32];
  float fVar76;
  float fVar77;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar75 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar113;
  float fVar114;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  float fVar115;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar140;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [64];
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar155 [64];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MapUV<embree::avx2::GridSOA::Gather3x3> mapUV;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  long local_1470;
  int local_1468;
  int local_1464;
  undefined1 local_1460 [56];
  RayQueryContext *local_1428;
  undefined1 local_1420 [8];
  undefined1 auStack_1418 [8];
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  undefined1 local_1400 [8];
  undefined1 auStack_13f8 [8];
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  undefined1 local_13e0 [32];
  undefined8 local_13c0;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  RTCFilterFunctionNArguments local_1390;
  undefined1 local_1360 [8];
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  float local_12e0;
  undefined4 local_12dc;
  undefined4 local_12d8;
  float local_12d4;
  float local_12d0;
  uint local_12cc;
  undefined4 local_12c8;
  uint local_12c4;
  uint local_12c0;
  undefined1 (*local_12a8) [16];
  ulong local_12a0;
  ulong local_1298;
  undefined1 local_1290 [16];
  undefined1 local_1280 [8];
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined1 local_1260 [32];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  float local_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined1 (**local_1140) [16];
  undefined1 local_1120 [32];
  float local_1100 [4];
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  float local_10e0 [4];
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [2] [32];
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f98 = 0;
    if (local_fa0 != 8) {
      pauVar68 = (undefined1 (*) [16])local_f90;
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar92 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar99 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar97._8_4_ = 0x7fffffff;
      auVar97._0_8_ = 0x7fffffff7fffffff;
      auVar97._12_4_ = 0x7fffffff;
      auVar97 = vandps_avx((undefined1  [16])aVar2,auVar97);
      auVar83._8_4_ = 0x219392ef;
      auVar83._0_8_ = 0x219392ef219392ef;
      auVar83._12_4_ = 0x219392ef;
      auVar97 = vcmpps_avx(auVar97,auVar83,1);
      auVar106._8_4_ = 0x3f800000;
      auVar106._0_8_ = &DAT_3f8000003f800000;
      auVar106._12_4_ = 0x3f800000;
      auVar83 = vdivps_avx(auVar106,(undefined1  [16])aVar2);
      auVar107._8_4_ = 0x5d5e0b6b;
      auVar107._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar107._12_4_ = 0x5d5e0b6b;
      auVar97 = vblendvps_avx(auVar83,auVar107,auVar97);
      auVar98._0_4_ = auVar97._0_4_ * 0.99999964;
      auVar98._4_4_ = auVar97._4_4_ * 0.99999964;
      auVar98._8_4_ = auVar97._8_4_ * 0.99999964;
      auVar98._12_4_ = auVar97._12_4_ * 0.99999964;
      auVar91._0_4_ = auVar97._0_4_ * 1.0000004;
      auVar91._4_4_ = auVar97._4_4_ * 1.0000004;
      auVar91._8_4_ = auVar97._8_4_ * 1.0000004;
      auVar91._12_4_ = auVar97._12_4_ * 1.0000004;
      uVar70 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_11b0._4_4_ = uVar70;
      local_11b0._0_4_ = uVar70;
      local_11b0._8_4_ = uVar70;
      local_11b0._12_4_ = uVar70;
      auVar134 = ZEXT1664(local_11b0);
      uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_11c0._4_4_ = uVar70;
      local_11c0._0_4_ = uVar70;
      local_11c0._8_4_ = uVar70;
      local_11c0._12_4_ = uVar70;
      auVar139 = ZEXT1664(local_11c0);
      uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_11d0._4_4_ = uVar70;
      local_11d0._0_4_ = uVar70;
      local_11d0._8_4_ = uVar70;
      local_11d0._12_4_ = uVar70;
      auVar143 = ZEXT1664(local_11d0);
      auVar97 = vmovshdup_avx(auVar98);
      local_11f0 = vshufps_avx(auVar98,auVar98,0x55);
      auVar155 = ZEXT1664(local_11f0);
      auVar83 = vshufpd_avx(auVar98,auVar98,1);
      local_1200 = vshufps_avx(auVar98,auVar98,0xaa);
      auVar157 = ZEXT1664(local_1200);
      local_1220 = vshufps_avx(auVar91,auVar91,0x55);
      auVar163 = ZEXT1664(local_1220);
      uVar58 = (ulong)(auVar98._0_4_ < 0.0) * 0x10;
      local_1230 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar166 = ZEXT1664(local_1230);
      uVar63 = (ulong)(auVar97._0_4_ < 0.0) << 4 | 0x20;
      uVar69 = (ulong)(auVar83._0_4_ < 0.0) << 4 | 0x40;
      uVar70 = auVar92._0_4_;
      local_1290._4_4_ = uVar70;
      local_1290._0_4_ = uVar70;
      local_1290._8_4_ = uVar70;
      local_1290._12_4_ = uVar70;
      auVar130 = ZEXT1664(local_1290);
      local_1060[1]._0_8_ = mm_lookupmask_pd._0_8_;
      local_1060[1]._8_8_ = mm_lookupmask_pd._8_8_;
      local_1060[1]._16_8_ = mm_lookupmask_pd._0_8_;
      local_1060[1]._24_8_ = mm_lookupmask_pd._8_8_;
      uVar70 = auVar99._0_4_;
      auVar75 = ZEXT1664(CONCAT412(uVar70,CONCAT48(uVar70,CONCAT44(uVar70,uVar70))));
      local_1470 = 0;
      local_1428 = context;
      local_11e0 = auVar98._0_4_;
      fStack_11dc = auVar98._0_4_;
      fStack_11d8 = auVar98._0_4_;
      fStack_11d4 = auVar98._0_4_;
      local_1210 = auVar91._0_4_;
      fStack_120c = auVar91._0_4_;
      fStack_1208 = auVar91._0_4_;
      fStack_1204 = auVar91._0_4_;
      fVar152 = auVar98._0_4_;
      fVar153 = auVar98._0_4_;
      fVar154 = auVar98._0_4_;
      fVar160 = auVar91._0_4_;
      fVar161 = auVar91._0_4_;
      fVar162 = auVar91._0_4_;
      do {
        do {
          do {
            if (pauVar68 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            pauVar61 = pauVar68 + -1;
            pauVar68 = pauVar68 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar61 + 8));
          uVar66 = *(ulong *)*pauVar68;
          do {
            if ((uVar66 & 8) == 0) {
              uVar54 = uVar66 & 0xfffffffffffffff0;
              uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
              auVar82._4_4_ = uVar70;
              auVar82._0_4_ = uVar70;
              auVar82._8_4_ = uVar70;
              auVar82._12_4_ = uVar70;
              auVar97 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar54 + 0x80 + uVar58),auVar82,
                                        *(undefined1 (*) [16])(uVar54 + 0x20 + uVar58));
              auVar97 = vsubps_avx(auVar97,auVar134._0_16_);
              auVar92._0_4_ = auVar98._0_4_ * auVar97._0_4_;
              auVar92._4_4_ = fVar152 * auVar97._4_4_;
              auVar92._8_4_ = fVar153 * auVar97._8_4_;
              auVar92._12_4_ = fVar154 * auVar97._12_4_;
              auVar97 = vmaxps_avx(auVar130._0_16_,auVar92);
              auVar83 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar54 + 0x80 + uVar63),auVar82,
                                        *(undefined1 (*) [16])(uVar54 + 0x20 + uVar63));
              auVar83 = vsubps_avx(auVar83,auVar139._0_16_);
              auVar99._0_4_ = auVar155._0_4_ * auVar83._0_4_;
              auVar99._4_4_ = auVar155._4_4_ * auVar83._4_4_;
              auVar99._8_4_ = auVar155._8_4_ * auVar83._8_4_;
              auVar99._12_4_ = auVar155._12_4_ * auVar83._12_4_;
              auVar83 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar54 + 0x80 + uVar69),auVar82,
                                        *(undefined1 (*) [16])(uVar54 + 0x20 + uVar69));
              auVar83 = vsubps_avx(auVar83,auVar143._0_16_);
              auVar108._0_4_ = auVar157._0_4_ * auVar83._0_4_;
              auVar108._4_4_ = auVar157._4_4_ * auVar83._4_4_;
              auVar108._8_4_ = auVar157._8_4_ * auVar83._8_4_;
              auVar108._12_4_ = auVar157._12_4_ * auVar83._12_4_;
              auVar83 = vmaxps_avx(auVar99,auVar108);
              auVar97 = vmaxps_avx(auVar97,auVar83);
              auVar83 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar54 + 0x80 + (uVar58 ^ 0x10)),
                                        auVar82,*(undefined1 (*) [16])
                                                 (uVar54 + 0x20 + (uVar58 ^ 0x10)));
              auVar83 = vsubps_avx(auVar83,auVar134._0_16_);
              auVar100._0_4_ = auVar91._0_4_ * auVar83._0_4_;
              auVar100._4_4_ = fVar160 * auVar83._4_4_;
              auVar100._8_4_ = fVar161 * auVar83._8_4_;
              auVar100._12_4_ = fVar162 * auVar83._12_4_;
              auVar83 = vminps_avx(auVar75._0_16_,auVar100);
              auVar92 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar54 + 0x80 + (uVar63 ^ 0x10)),
                                        auVar82,*(undefined1 (*) [16])
                                                 (uVar54 + 0x20 + (uVar63 ^ 0x10)));
              auVar92 = vsubps_avx(auVar92,auVar139._0_16_);
              auVar99 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar54 + 0x80 + (uVar69 ^ 0x10)),
                                        auVar82,*(undefined1 (*) [16])
                                                 (uVar54 + 0x20 + (uVar69 ^ 0x10)));
              auVar109._0_4_ = auVar163._0_4_ * auVar92._0_4_;
              auVar109._4_4_ = auVar163._4_4_ * auVar92._4_4_;
              auVar109._8_4_ = auVar163._8_4_ * auVar92._8_4_;
              auVar109._12_4_ = auVar163._12_4_ * auVar92._12_4_;
              auVar92 = vsubps_avx(auVar99,auVar143._0_16_);
              auVar116._0_4_ = auVar166._0_4_ * auVar92._0_4_;
              auVar116._4_4_ = auVar166._4_4_ * auVar92._4_4_;
              auVar116._8_4_ = auVar166._8_4_ * auVar92._8_4_;
              auVar116._12_4_ = auVar166._12_4_ * auVar92._12_4_;
              auVar92 = vminps_avx(auVar109,auVar116);
              auVar83 = vminps_avx(auVar83,auVar92);
              if (((uint)uVar66 & 7) == 6) {
                auVar92 = vcmpps_avx(auVar97,auVar83,2);
                auVar83 = vcmpps_avx(*(undefined1 (*) [16])(uVar54 + 0xe0),auVar82,2);
                auVar99 = vcmpps_avx(auVar82,*(undefined1 (*) [16])(uVar54 + 0xf0),1);
                auVar83 = vandps_avx(auVar83,auVar99);
                auVar83 = vandps_avx(auVar83,auVar92);
              }
              else {
                auVar83 = vcmpps_avx(auVar97,auVar83,2);
              }
              auVar83 = vpslld_avx(auVar83,0x1f);
              uVar70 = vmovmskps_avx(auVar83);
              unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar70);
              local_11a0._0_16_ = auVar97;
            }
            if ((uVar66 & 8) == 0) {
              if (unaff_R14 == 0) {
                iVar52 = 4;
              }
              else {
                uVar54 = uVar66 & 0xfffffffffffffff0;
                lVar55 = 0;
                for (uVar66 = unaff_R14; (uVar66 & 1) == 0;
                    uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                  lVar55 = lVar55 + 1;
                }
                iVar52 = 0;
                uVar59 = unaff_R14 - 1 & unaff_R14;
                uVar66 = *(ulong *)(uVar54 + lVar55 * 8);
                if (uVar59 != 0) {
                  uVar3 = *(uint *)(local_11a0 + lVar55 * 4);
                  lVar55 = 0;
                  for (uVar20 = uVar59; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000
                      ) {
                    lVar55 = lVar55 + 1;
                  }
                  uVar59 = uVar59 - 1 & uVar59;
                  uVar20 = *(ulong *)(uVar54 + lVar55 * 8);
                  uVar65 = *(uint *)(local_11a0 + lVar55 * 4);
                  if (uVar59 == 0) {
                    if (uVar3 < uVar65) {
                      *(ulong *)*pauVar68 = uVar20;
                      *(uint *)(*pauVar68 + 8) = uVar65;
                      pauVar68 = pauVar68 + 1;
                    }
                    else {
                      *(ulong *)*pauVar68 = uVar66;
                      *(uint *)(*pauVar68 + 8) = uVar3;
                      uVar66 = uVar20;
                      pauVar68 = pauVar68 + 1;
                    }
                  }
                  else {
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = uVar66;
                    auVar97 = vpunpcklqdq_avx(auVar84,ZEXT416(uVar3));
                    auVar93._8_8_ = 0;
                    auVar93._0_8_ = uVar20;
                    auVar83 = vpunpcklqdq_avx(auVar93,ZEXT416(uVar65));
                    lVar55 = 0;
                    for (uVar66 = uVar59; (uVar66 & 1) == 0;
                        uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                      lVar55 = lVar55 + 1;
                    }
                    uVar59 = uVar59 - 1 & uVar59;
                    auVar101._8_8_ = 0;
                    auVar101._0_8_ = *(ulong *)(uVar54 + lVar55 * 8);
                    auVar99 = vpunpcklqdq_avx(auVar101,ZEXT416(*(uint *)(local_11a0 + lVar55 * 4)));
                    auVar92 = vpcmpgtd_avx(auVar83,auVar97);
                    if (uVar59 == 0) {
                      auVar106 = vpshufd_avx(auVar92,0xaa);
                      auVar92 = vblendvps_avx(auVar83,auVar97,auVar106);
                      auVar97 = vblendvps_avx(auVar97,auVar83,auVar106);
                      auVar83 = vpcmpgtd_avx(auVar99,auVar92);
                      auVar106 = vpshufd_avx(auVar83,0xaa);
                      auVar83 = vblendvps_avx(auVar99,auVar92,auVar106);
                      auVar92 = vblendvps_avx(auVar92,auVar99,auVar106);
                      auVar99 = vpcmpgtd_avx(auVar92,auVar97);
                      auVar106 = vpshufd_avx(auVar99,0xaa);
                      auVar99 = vblendvps_avx(auVar92,auVar97,auVar106);
                      auVar97 = vblendvps_avx(auVar97,auVar92,auVar106);
                      *pauVar68 = auVar97;
                      pauVar68[1] = auVar99;
                      uVar66 = auVar83._0_8_;
                      pauVar68 = pauVar68 + 2;
                    }
                    else {
                      lVar55 = 0;
                      for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
                        lVar55 = lVar55 + 1;
                      }
                      auVar117._8_8_ = 0;
                      auVar117._0_8_ = *(ulong *)(uVar54 + lVar55 * 8);
                      auVar107 = vpunpcklqdq_avx(auVar117,ZEXT416(*(uint *)(local_11a0 + lVar55 * 4)
                                                                 ));
                      auVar106 = vpshufd_avx(auVar92,0xaa);
                      auVar92 = vblendvps_avx(auVar83,auVar97,auVar106);
                      auVar97 = vblendvps_avx(auVar97,auVar83,auVar106);
                      auVar83 = vpcmpgtd_avx(auVar107,auVar99);
                      auVar106 = vpshufd_avx(auVar83,0xaa);
                      auVar83 = vblendvps_avx(auVar107,auVar99,auVar106);
                      auVar99 = vblendvps_avx(auVar99,auVar107,auVar106);
                      auVar106 = vpcmpgtd_avx(auVar99,auVar97);
                      auVar107 = vpshufd_avx(auVar106,0xaa);
                      auVar106 = vblendvps_avx(auVar99,auVar97,auVar107);
                      auVar97 = vblendvps_avx(auVar97,auVar99,auVar107);
                      auVar99 = vpcmpgtd_avx(auVar83,auVar92);
                      auVar107 = vpshufd_avx(auVar99,0xaa);
                      auVar99 = vblendvps_avx(auVar83,auVar92,auVar107);
                      auVar83 = vblendvps_avx(auVar92,auVar83,auVar107);
                      auVar92 = vpcmpgtd_avx(auVar106,auVar83);
                      auVar107 = vpshufd_avx(auVar92,0xaa);
                      auVar92 = vblendvps_avx(auVar106,auVar83,auVar107);
                      auVar83 = vblendvps_avx(auVar83,auVar106,auVar107);
                      *pauVar68 = auVar97;
                      pauVar68[1] = auVar83;
                      pauVar68[2] = auVar92;
                      auVar130 = ZEXT1664(local_1290);
                      uVar66 = auVar99._0_8_;
                      pauVar68 = pauVar68 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar52 = 6;
            }
          } while (iVar52 == 0);
        } while (iVar52 != 6);
        if (((uint)uVar66 & 0xf) == 8) {
          uVar3 = *(uint *)(local_1470 + 0xc);
          local_12a0 = (ulong)uVar3;
          uVar65 = *(uint *)(local_1470 + 0x10);
          local_1298 = (ulong)uVar65;
          lVar60 = (ulong)*(uint *)(local_1470 + 0x24) + local_1470 +
                   (long)local_1468 * (ulong)*(uint *)(local_1470 + 0x28);
          uVar66 = uVar66 >> 4;
          lVar55 = lVar60 + uVar66 * 4;
          lVar64 = lVar60 + uVar66 * 4 + 0x2c;
          auVar97 = *(undefined1 (*) [16])(lVar55 + 0x2c + local_12a0 * 4);
          auVar83 = auVar97;
          if (2 < local_1298) {
            auVar83 = *(undefined1 (*) [16])(lVar64 + local_12a0 * 8);
          }
          auVar92 = *(undefined1 (*) [16])(lVar60 + 0x2c + uVar66 * 4);
          if (local_12a0 == 2) {
            auVar92 = vshufps_avx(auVar92,auVar92,0x54);
            auVar97 = vshufps_avx(auVar97,auVar97,0x54);
            auVar83 = vshufps_avx(auVar83,auVar83,0x54);
          }
          uVar66 = (ulong)*(uint *)(local_1470 + 0x14);
          pauVar61 = (undefined1 (*) [16])(lVar55 + uVar66 * 4 + 0x2c);
          auVar99 = *(undefined1 (*) [16])(*pauVar61 + local_12a0 * 4);
          auVar91 = auVar99;
          if (2 < uVar65) {
            auVar91 = *(undefined1 (*) [16])(*pauVar61 + local_12a0 * 8);
          }
          auVar98 = *pauVar61;
          if (uVar3 == 2) {
            auVar98 = vshufps_avx(auVar98,auVar98,0x54);
            auVar99 = vshufps_avx(auVar99,auVar99,0x54);
            auVar91 = vshufps_avx(auVar91,auVar91,0x54);
          }
          pauVar67 = (undefined1 (*) [16])(lVar55 + uVar66 * 8 + 0x2c);
          auVar106 = *(undefined1 (*) [16])(*pauVar67 + local_12a0 * 4);
          auVar107 = auVar106;
          if (2 < uVar65) {
            auVar107 = *(undefined1 (*) [16])(*pauVar67 + local_12a0 * 8);
          }
          _local_1400 = *pauVar67;
          if (uVar3 == 2) {
            _local_1400 = vshufps_avx(_local_1400,_local_1400,0x54);
            auVar106 = vshufps_avx(auVar106,auVar106,0x54);
            auVar107 = vshufps_avx(auVar107,auVar107,0x54);
          }
          uVar54 = (ulong)(*(uint *)(local_1470 + 0x28) & 0xfffffffc);
          auVar82 = *(undefined1 (*) [16])(lVar64 + uVar54 + local_12a0 * 4);
          auVar100 = auVar82;
          if (2 < uVar65) {
            auVar100 = *(undefined1 (*) [16])(lVar64 + uVar54 + local_12a0 * 8);
          }
          auVar108 = *(undefined1 (*) [16])(lVar64 + uVar54);
          if (uVar3 == 2) {
            auVar108 = vshufps_avx(auVar108,auVar108,0x54);
            auVar82 = vshufps_avx(auVar82,auVar82,0x54);
            auVar100 = vshufps_avx(auVar100,auVar100,0x54);
          }
          pauVar61 = (undefined1 (*) [16])(*pauVar61 + uVar54);
          auVar109 = *(undefined1 (*) [16])(*pauVar61 + local_12a0 * 4);
          auVar116 = auVar109;
          if (2 < uVar65) {
            auVar116 = *(undefined1 (*) [16])(*pauVar61 + local_12a0 * 8);
          }
          _local_1420 = *pauVar61;
          if (uVar3 == 2) {
            _local_1420 = vshufps_avx(_local_1420,_local_1420,0x54);
            auVar109 = vshufps_avx(auVar109,auVar109,0x54);
            auVar116 = vshufps_avx(auVar116,auVar116,0x54);
          }
          pauVar61 = (undefined1 (*) [16])(*pauVar67 + uVar54);
          auVar101 = *pauVar61;
          auVar84 = *(undefined1 (*) [16])(*pauVar61 + local_12a0 * 4);
          auVar93 = auVar84;
          if (2 < uVar65) {
            auVar93 = *(undefined1 (*) [16])(*pauVar61 + local_12a0 * 8);
          }
          auVar127._16_16_ = auVar97;
          auVar127._0_16_ = auVar92;
          auVar85._16_16_ = auVar83;
          auVar85._0_16_ = auVar97;
          auVar15 = vunpcklps_avx(auVar127,auVar85);
          auVar127 = vshufps_avx(auVar127,auVar127,0xa5);
          auVar85 = vshufps_avx(auVar85,auVar85,0x94);
          auVar128._16_16_ = auVar99;
          auVar128._0_16_ = auVar98;
          auVar102._16_16_ = auVar91;
          auVar102._0_16_ = auVar99;
          auVar16 = vunpcklps_avx(auVar128,auVar102);
          auVar128 = vshufps_avx(auVar128,auVar128,0xa5);
          auVar102 = vshufps_avx(auVar102,auVar102,0x94);
          auVar129._16_16_ = auVar106;
          auVar129._0_16_ = _local_1400;
          auVar123._16_16_ = auVar107;
          auVar123._0_16_ = auVar106;
          auVar17 = vunpcklps_avx(auVar129,auVar123);
          auVar129 = vshufps_avx(auVar129,auVar129,0xa5);
          auVar123 = vshufps_avx(auVar123,auVar123,0x94);
          auVar135._16_16_ = auVar82;
          auVar135._0_16_ = auVar108;
          auVar132._16_16_ = auVar100;
          auVar132._0_16_ = auVar82;
          auVar18 = vunpcklps_avx(auVar135,auVar132);
          auVar135 = vshufps_avx(auVar135,auVar135,0xa5);
          auVar132 = vshufps_avx(auVar132,auVar132,0x94);
          auVar96._16_16_ = auVar109;
          auVar96._0_16_ = _local_1420;
          auVar138._16_16_ = auVar116;
          auVar138._0_16_ = auVar109;
          auVar19 = vunpcklps_avx(auVar96,auVar138);
          auVar96 = vshufps_avx(auVar96,auVar96,0xa5);
          auVar138 = vshufps_avx(auVar138,auVar138,0x94);
          if (uVar3 == 2) {
            auVar101 = vshufps_avx(auVar101,auVar101,0x54);
            auVar84 = vshufps_avx(auVar84,auVar84,0x54);
            auVar93 = vshufps_avx(auVar93,auVar93,0x54);
          }
          auVar136._16_16_ = auVar84;
          auVar136._0_16_ = auVar101;
          auVar164._16_16_ = auVar93;
          auVar164._0_16_ = auVar84;
          fVar152 = 1.0 - (float)local_1240._0_4_;
          auVar156._4_4_ = fVar152;
          auVar156._0_4_ = fVar152;
          auVar156._8_4_ = fVar152;
          auVar156._12_4_ = fVar152;
          auVar156._16_4_ = fVar152;
          auVar156._20_4_ = fVar152;
          auVar156._24_4_ = fVar152;
          auVar156._28_4_ = fVar152;
          auVar21._4_4_ = (float)local_1240._0_4_ * auVar18._4_4_;
          auVar21._0_4_ = (float)local_1240._0_4_ * auVar18._0_4_;
          auVar21._8_4_ = (float)local_1240._0_4_ * auVar18._8_4_;
          auVar21._12_4_ = (float)local_1240._0_4_ * auVar18._12_4_;
          auVar21._16_4_ = (float)local_1240._0_4_ * auVar18._16_4_;
          auVar21._20_4_ = (float)local_1240._0_4_ * auVar18._20_4_;
          auVar21._24_4_ = (float)local_1240._0_4_ * auVar18._24_4_;
          auVar21._28_4_ = auVar18._28_4_;
          auVar97 = vfmadd213ps_fma(auVar15,auVar156,auVar21);
          auVar22._4_4_ = (float)local_1240._0_4_ * auVar19._4_4_;
          auVar22._0_4_ = (float)local_1240._0_4_ * auVar19._0_4_;
          auVar22._8_4_ = (float)local_1240._0_4_ * auVar19._8_4_;
          auVar22._12_4_ = (float)local_1240._0_4_ * auVar19._12_4_;
          auVar22._16_4_ = (float)local_1240._0_4_ * auVar19._16_4_;
          auVar22._20_4_ = (float)local_1240._0_4_ * auVar19._20_4_;
          auVar22._24_4_ = (float)local_1240._0_4_ * auVar19._24_4_;
          auVar22._28_4_ = auVar18._28_4_;
          auVar83 = vfmadd213ps_fma(auVar16,auVar156,auVar22);
          auVar15 = vunpcklps_avx(auVar136,auVar164);
          auVar16._4_4_ = (float)local_1240._0_4_ * auVar15._4_4_;
          auVar16._0_4_ = (float)local_1240._0_4_ * auVar15._0_4_;
          auVar16._8_4_ = (float)local_1240._0_4_ * auVar15._8_4_;
          auVar16._12_4_ = (float)local_1240._0_4_ * auVar15._12_4_;
          auVar16._16_4_ = (float)local_1240._0_4_ * auVar15._16_4_;
          auVar16._20_4_ = (float)local_1240._0_4_ * auVar15._20_4_;
          auVar16._24_4_ = (float)local_1240._0_4_ * auVar15._24_4_;
          auVar16._28_4_ = auVar15._28_4_;
          auVar92 = vfmadd213ps_fma(auVar17,auVar156,auVar16);
          local_1280._0_4_ = auVar135._0_4_;
          local_1280._4_4_ = auVar135._4_4_;
          fStack_1278 = auVar135._8_4_;
          fStack_1274 = auVar135._12_4_;
          fStack_1270 = auVar135._16_4_;
          fStack_126c = auVar135._20_4_;
          fStack_1268 = auVar135._24_4_;
          auVar17._4_4_ = (float)local_1240._0_4_ * (float)local_1280._4_4_;
          auVar17._0_4_ = (float)local_1240._0_4_ * (float)local_1280._0_4_;
          auVar17._8_4_ = (float)local_1240._0_4_ * fStack_1278;
          auVar17._12_4_ = (float)local_1240._0_4_ * fStack_1274;
          auVar17._16_4_ = (float)local_1240._0_4_ * fStack_1270;
          auVar17._20_4_ = (float)local_1240._0_4_ * fStack_126c;
          auVar17._24_4_ = (float)local_1240._0_4_ * fStack_1268;
          auVar17._28_4_ = auVar15._28_4_;
          auVar99 = vfmadd213ps_fma(auVar127,auVar156,auVar17);
          auVar127 = vshufps_avx(auVar136,auVar136,0xa5);
          auVar135 = vshufps_avx(auVar164,auVar164,0x94);
          local_1360._0_4_ = auVar96._0_4_;
          local_1360._4_4_ = auVar96._4_4_;
          fStack_1358 = auVar96._8_4_;
          fStack_1354 = auVar96._12_4_;
          fStack_1350 = auVar96._16_4_;
          fStack_134c = auVar96._20_4_;
          fStack_1348 = auVar96._24_4_;
          auVar158._0_4_ = (float)local_1240._0_4_ * (float)local_1360._0_4_;
          auVar158._4_4_ = (float)local_1240._0_4_ * (float)local_1360._4_4_;
          auVar158._8_4_ = (float)local_1240._0_4_ * fStack_1358;
          auVar158._12_4_ = (float)local_1240._0_4_ * fStack_1354;
          auVar158._16_4_ = (float)local_1240._0_4_ * fStack_1350;
          auVar158._20_4_ = (float)local_1240._0_4_ * fStack_134c;
          auVar158._24_4_ = (float)local_1240._0_4_ * fStack_1348;
          auVar158._28_4_ = 0;
          auVar18._4_4_ = (float)local_1240._0_4_ * auVar127._4_4_;
          auVar18._0_4_ = (float)local_1240._0_4_ * auVar127._0_4_;
          auVar18._8_4_ = (float)local_1240._0_4_ * auVar127._8_4_;
          auVar18._12_4_ = (float)local_1240._0_4_ * auVar127._12_4_;
          auVar18._16_4_ = (float)local_1240._0_4_ * auVar127._16_4_;
          auVar18._20_4_ = (float)local_1240._0_4_ * auVar127._20_4_;
          auVar18._24_4_ = (float)local_1240._0_4_ * auVar127._24_4_;
          auVar18._28_4_ = auVar127._28_4_;
          auVar91 = vfmadd213ps_fma(auVar128,auVar156,auVar158);
          auVar98 = vfmadd213ps_fma(auVar129,auVar156,auVar18);
          local_1400._0_4_ = auVar132._0_4_;
          local_1400._4_4_ = auVar132._4_4_;
          auStack_13f8._0_4_ = auVar132._8_4_;
          auStack_13f8._4_4_ = auVar132._12_4_;
          fStack_13f0 = auVar132._16_4_;
          fStack_13ec = auVar132._20_4_;
          fStack_13e8 = auVar132._24_4_;
          auVar19._4_4_ = (float)local_1240._0_4_ * (float)local_1400._4_4_;
          auVar19._0_4_ = (float)local_1240._0_4_ * (float)local_1400._0_4_;
          auVar19._8_4_ = (float)local_1240._0_4_ * (float)auStack_13f8._0_4_;
          auVar19._12_4_ = (float)local_1240._0_4_ * (float)auStack_13f8._4_4_;
          auVar19._16_4_ = (float)local_1240._0_4_ * fStack_13f0;
          auVar19._20_4_ = (float)local_1240._0_4_ * fStack_13ec;
          auVar19._24_4_ = (float)local_1240._0_4_ * fStack_13e8;
          auVar19._28_4_ = auVar127._28_4_;
          local_1420._0_4_ = auVar138._0_4_;
          local_1420._4_4_ = auVar138._4_4_;
          auStack_1418._0_4_ = auVar138._8_4_;
          auStack_1418._4_4_ = auVar138._12_4_;
          fStack_1410 = auVar138._16_4_;
          fStack_140c = auVar138._20_4_;
          fStack_1408 = auVar138._24_4_;
          auVar23._4_4_ = (float)local_1240._0_4_ * (float)local_1420._4_4_;
          auVar23._0_4_ = (float)local_1240._0_4_ * (float)local_1420._0_4_;
          auVar23._8_4_ = (float)local_1240._0_4_ * (float)auStack_1418._0_4_;
          auVar23._12_4_ = (float)local_1240._0_4_ * (float)auStack_1418._4_4_;
          auVar23._16_4_ = (float)local_1240._0_4_ * fStack_1410;
          auVar23._20_4_ = (float)local_1240._0_4_ * fStack_140c;
          auVar23._24_4_ = (float)local_1240._0_4_ * fStack_1408;
          auVar23._28_4_ = 0;
          auVar24._4_4_ = (float)local_1240._0_4_ * auVar135._4_4_;
          auVar24._0_4_ = (float)local_1240._0_4_ * auVar135._0_4_;
          auVar24._8_4_ = (float)local_1240._0_4_ * auVar135._8_4_;
          auVar24._12_4_ = (float)local_1240._0_4_ * auVar135._12_4_;
          auVar24._16_4_ = (float)local_1240._0_4_ * auVar135._16_4_;
          auVar24._20_4_ = (float)local_1240._0_4_ * auVar135._20_4_;
          auVar24._24_4_ = (float)local_1240._0_4_ * auVar135._24_4_;
          auVar24._28_4_ = auVar135._28_4_;
          auVar106 = vfmadd213ps_fma(auVar85,auVar156,auVar19);
          auVar107 = vfmadd213ps_fma(auVar102,auVar156,auVar23);
          uVar70 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar137._4_4_ = uVar70;
          auVar137._0_4_ = uVar70;
          auVar137._8_4_ = uVar70;
          auVar137._12_4_ = uVar70;
          auVar137._16_4_ = uVar70;
          auVar137._20_4_ = uVar70;
          auVar137._24_4_ = uVar70;
          auVar137._28_4_ = uVar70;
          uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar159._4_4_ = uVar70;
          auVar159._0_4_ = uVar70;
          auVar159._8_4_ = uVar70;
          auVar159._12_4_ = uVar70;
          auVar159._16_4_ = uVar70;
          auVar159._20_4_ = uVar70;
          auVar159._24_4_ = uVar70;
          auVar159._28_4_ = uVar70;
          auVar82 = vfmadd213ps_fma(auVar123,auVar156,auVar24);
          uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar150._4_4_ = uVar1;
          auVar150._0_4_ = uVar1;
          auVar150._8_4_ = uVar1;
          auVar150._12_4_ = uVar1;
          auVar150._16_4_ = uVar1;
          auVar150._20_4_ = uVar1;
          auVar150._24_4_ = uVar1;
          auVar150._28_4_ = uVar1;
          _local_1400 = vsubps_avx(ZEXT1632(auVar97),auVar137);
          local_1300 = vsubps_avx(ZEXT1632(auVar83),auVar159);
          _local_1420 = vsubps_avx(ZEXT1632(auVar92),auVar150);
          auVar127 = vsubps_avx(ZEXT1632(auVar99),auVar137);
          auVar85 = vsubps_avx(ZEXT1632(auVar91),auVar159);
          auVar128 = vsubps_avx(ZEXT1632(auVar98),auVar150);
          auVar102 = vsubps_avx(ZEXT1632(auVar106),auVar137);
          auVar129 = vsubps_avx(ZEXT1632(auVar107),auVar159);
          auVar123 = vsubps_avx(ZEXT1632(auVar82),auVar150);
          local_1320 = vsubps_avx(auVar102,_local_1400);
          _local_1360 = vsubps_avx(auVar129,local_1300);
          local_1340 = vsubps_avx(auVar123,_local_1420);
          auVar94._0_4_ = auVar102._0_4_ + local_1400._0_4_;
          auVar94._4_4_ = auVar102._4_4_ + local_1400._4_4_;
          auVar94._8_4_ = auVar102._8_4_ + local_1400._8_4_;
          auVar94._12_4_ = auVar102._12_4_ + local_1400._12_4_;
          auVar94._16_4_ = auVar102._16_4_ + local_1400._16_4_;
          auVar94._20_4_ = auVar102._20_4_ + local_1400._20_4_;
          auVar94._24_4_ = auVar102._24_4_ + local_1400._24_4_;
          auVar94._28_4_ = auVar102._28_4_ + local_1400._28_4_;
          auVar103._0_4_ = local_1300._0_4_ + auVar129._0_4_;
          auVar103._4_4_ = local_1300._4_4_ + auVar129._4_4_;
          auVar103._8_4_ = local_1300._8_4_ + auVar129._8_4_;
          auVar103._12_4_ = local_1300._12_4_ + auVar129._12_4_;
          auVar103._16_4_ = local_1300._16_4_ + auVar129._16_4_;
          auVar103._20_4_ = local_1300._20_4_ + auVar129._20_4_;
          auVar103._24_4_ = local_1300._24_4_ + auVar129._24_4_;
          auVar103._28_4_ = local_1300._28_4_ + auVar129._28_4_;
          fVar152 = local_1420._0_4_;
          auVar118._0_4_ = auVar123._0_4_ + fVar152;
          fVar153 = local_1420._4_4_;
          auVar118._4_4_ = auVar123._4_4_ + fVar153;
          fVar154 = local_1420._8_4_;
          auVar118._8_4_ = auVar123._8_4_ + fVar154;
          auVar98._0_4_ = local_1420._12_4_;
          auVar118._12_4_ = auVar123._12_4_ + auVar98._0_4_;
          fVar160 = local_1420._16_4_;
          auVar118._16_4_ = auVar123._16_4_ + fVar160;
          fVar161 = local_1420._20_4_;
          auVar118._20_4_ = auVar123._20_4_ + fVar161;
          fVar162 = local_1420._24_4_;
          auVar118._24_4_ = auVar123._24_4_ + fVar162;
          auVar91._0_4_ = local_1420._28_4_;
          auVar118._28_4_ = auVar123._28_4_ + auVar91._0_4_;
          auVar25._4_4_ = local_1340._4_4_ * auVar103._4_4_;
          auVar25._0_4_ = local_1340._0_4_ * auVar103._0_4_;
          auVar25._8_4_ = local_1340._8_4_ * auVar103._8_4_;
          auVar25._12_4_ = local_1340._12_4_ * auVar103._12_4_;
          auVar25._16_4_ = local_1340._16_4_ * auVar103._16_4_;
          auVar25._20_4_ = local_1340._20_4_ * auVar103._20_4_;
          auVar25._24_4_ = local_1340._24_4_ * auVar103._24_4_;
          auVar25._28_4_ = uVar70;
          auVar83 = vfmsub231ps_fma(auVar25,_local_1360,auVar118);
          auVar26._4_4_ = local_1320._4_4_ * auVar118._4_4_;
          auVar26._0_4_ = local_1320._0_4_ * auVar118._0_4_;
          auVar26._8_4_ = local_1320._8_4_ * auVar118._8_4_;
          auVar26._12_4_ = local_1320._12_4_ * auVar118._12_4_;
          auVar26._16_4_ = local_1320._16_4_ * auVar118._16_4_;
          auVar26._20_4_ = local_1320._20_4_ * auVar118._20_4_;
          auVar26._24_4_ = local_1320._24_4_ * auVar118._24_4_;
          auVar26._28_4_ = auVar118._28_4_;
          auVar97 = vfmsub231ps_fma(auVar26,local_1340,auVar94);
          auVar27._4_4_ = local_1360._4_4_ * auVar94._4_4_;
          auVar27._0_4_ = local_1360._0_4_ * auVar94._0_4_;
          auVar27._8_4_ = local_1360._8_4_ * auVar94._8_4_;
          auVar27._12_4_ = local_1360._12_4_ * auVar94._12_4_;
          auVar27._16_4_ = local_1360._16_4_ * auVar94._16_4_;
          auVar27._20_4_ = local_1360._20_4_ * auVar94._20_4_;
          auVar27._24_4_ = local_1360._24_4_ * auVar94._24_4_;
          auVar27._28_4_ = auVar94._28_4_;
          auVar92 = vfmsub231ps_fma(auVar27,local_1320,auVar103);
          uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
          local_1460._4_4_ = uVar70;
          local_1460._0_4_ = uVar70;
          local_1460._8_4_ = uVar70;
          local_1460._12_4_ = uVar70;
          local_1460._16_4_ = uVar70;
          local_1460._20_4_ = uVar70;
          local_1460._24_4_ = uVar70;
          local_1460._28_4_ = uVar70;
          local_13c0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar95._0_4_ = local_13c0._4_4_ * auVar92._0_4_;
          auVar95._4_4_ = local_13c0._4_4_ * auVar92._4_4_;
          auVar95._8_4_ = local_13c0._4_4_ * auVar92._8_4_;
          auVar95._12_4_ = local_13c0._4_4_ * auVar92._12_4_;
          auVar95._16_4_ = local_13c0._4_4_ * 0.0;
          auVar95._20_4_ = local_13c0._4_4_ * 0.0;
          auVar95._24_4_ = local_13c0._4_4_ * 0.0;
          auVar95._28_4_ = 0;
          auVar97 = vfmadd231ps_fma(auVar95,local_1460._0_32_,ZEXT1632(auVar97));
          uVar70 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          auVar165._4_4_ = uVar70;
          auVar165._0_4_ = uVar70;
          auVar165._8_4_ = uVar70;
          auVar165._12_4_ = uVar70;
          auVar165._16_4_ = uVar70;
          auVar165._20_4_ = uVar70;
          auVar165._24_4_ = uVar70;
          auVar165._28_4_ = uVar70;
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar165,ZEXT1632(auVar83));
          _local_1280 = vsubps_avx(local_1300,auVar85);
          local_fc0 = vsubps_avx(_local_1420,auVar128);
          auVar104._0_4_ = local_1300._0_4_ + auVar85._0_4_;
          auVar104._4_4_ = local_1300._4_4_ + auVar85._4_4_;
          auVar104._8_4_ = local_1300._8_4_ + auVar85._8_4_;
          auVar104._12_4_ = local_1300._12_4_ + auVar85._12_4_;
          auVar104._16_4_ = local_1300._16_4_ + auVar85._16_4_;
          auVar104._20_4_ = local_1300._20_4_ + auVar85._20_4_;
          auVar104._24_4_ = local_1300._24_4_ + auVar85._24_4_;
          auVar104._28_4_ = local_1300._28_4_ + auVar85._28_4_;
          auVar119._0_4_ = auVar128._0_4_ + fVar152;
          auVar119._4_4_ = auVar128._4_4_ + fVar153;
          auVar119._8_4_ = auVar128._8_4_ + fVar154;
          auVar119._12_4_ = auVar128._12_4_ + auVar98._0_4_;
          auVar119._16_4_ = auVar128._16_4_ + fVar160;
          auVar119._20_4_ = auVar128._20_4_ + fVar161;
          auVar119._24_4_ = auVar128._24_4_ + fVar162;
          auVar119._28_4_ = auVar128._28_4_ + auVar91._0_4_;
          fVar113 = local_fc0._0_4_;
          fVar114 = local_fc0._4_4_;
          auVar28._4_4_ = auVar104._4_4_ * fVar114;
          auVar28._0_4_ = auVar104._0_4_ * fVar113;
          fVar5 = local_fc0._8_4_;
          auVar28._8_4_ = auVar104._8_4_ * fVar5;
          fVar7 = local_fc0._12_4_;
          auVar28._12_4_ = auVar104._12_4_ * fVar7;
          fVar9 = local_fc0._16_4_;
          auVar28._16_4_ = auVar104._16_4_ * fVar9;
          fVar11 = local_fc0._20_4_;
          auVar28._20_4_ = auVar104._20_4_ * fVar11;
          fVar13 = local_fc0._24_4_;
          auVar28._24_4_ = auVar104._24_4_ * fVar13;
          auVar28._28_4_ = auVar91._0_4_;
          auVar92 = vfmsub231ps_fma(auVar28,_local_1280,auVar119);
          local_fe0 = vsubps_avx(_local_1400,auVar127);
          auVar91._0_4_ = local_fe0._0_4_;
          fVar115 = local_fe0._4_4_;
          auVar29._4_4_ = auVar119._4_4_ * fVar115;
          auVar29._0_4_ = auVar119._0_4_ * auVar91._0_4_;
          fVar6 = local_fe0._8_4_;
          auVar29._8_4_ = auVar119._8_4_ * fVar6;
          fVar8 = local_fe0._12_4_;
          auVar29._12_4_ = auVar119._12_4_ * fVar8;
          fVar10 = local_fe0._16_4_;
          auVar29._16_4_ = auVar119._16_4_ * fVar10;
          fVar12 = local_fe0._20_4_;
          auVar29._20_4_ = auVar119._20_4_ * fVar12;
          fVar14 = local_fe0._24_4_;
          auVar29._24_4_ = auVar119._24_4_ * fVar14;
          auVar29._28_4_ = local_1320._28_4_;
          auVar120._0_4_ = auVar127._0_4_ + local_1400._0_4_;
          auVar120._4_4_ = auVar127._4_4_ + local_1400._4_4_;
          auVar120._8_4_ = auVar127._8_4_ + local_1400._8_4_;
          auVar120._12_4_ = auVar127._12_4_ + local_1400._12_4_;
          auVar120._16_4_ = auVar127._16_4_ + local_1400._16_4_;
          auVar120._20_4_ = auVar127._20_4_ + local_1400._20_4_;
          auVar120._24_4_ = auVar127._24_4_ + local_1400._24_4_;
          auVar120._28_4_ = auVar127._28_4_ + local_1400._28_4_;
          auVar83 = vfmsub231ps_fma(auVar29,local_fc0,auVar120);
          fVar140 = local_1280._0_4_;
          fVar144 = local_1280._4_4_;
          auVar30._4_4_ = fVar144 * auVar120._4_4_;
          auVar30._0_4_ = fVar140 * auVar120._0_4_;
          fVar145 = local_1280._8_4_;
          auVar30._8_4_ = fVar145 * auVar120._8_4_;
          fVar146 = local_1280._12_4_;
          auVar30._12_4_ = fVar146 * auVar120._12_4_;
          fVar147 = local_1280._16_4_;
          auVar30._16_4_ = fVar147 * auVar120._16_4_;
          fVar148 = local_1280._20_4_;
          auVar30._20_4_ = fVar148 * auVar120._20_4_;
          fVar149 = local_1280._24_4_;
          auVar30._24_4_ = fVar149 * auVar120._24_4_;
          auVar30._28_4_ = auVar120._28_4_;
          auVar99 = vfmsub231ps_fma(auVar30,local_fe0,auVar104);
          auVar121._0_4_ = local_13c0._4_4_ * auVar99._0_4_;
          auVar121._4_4_ = local_13c0._4_4_ * auVar99._4_4_;
          auVar121._8_4_ = local_13c0._4_4_ * auVar99._8_4_;
          auVar121._12_4_ = local_13c0._4_4_ * auVar99._12_4_;
          auVar121._16_4_ = local_13c0._4_4_ * 0.0;
          auVar121._20_4_ = local_13c0._4_4_ * 0.0;
          auVar121._24_4_ = local_13c0._4_4_ * 0.0;
          auVar121._28_4_ = 0;
          auVar83 = vfmadd231ps_fma(auVar121,local_1460._0_32_,ZEXT1632(auVar83));
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar165,ZEXT1632(auVar92));
          auVar135 = vsubps_avx(auVar127,auVar102);
          auVar86._0_4_ = auVar127._0_4_ + auVar102._0_4_;
          auVar86._4_4_ = auVar127._4_4_ + auVar102._4_4_;
          auVar86._8_4_ = auVar127._8_4_ + auVar102._8_4_;
          auVar86._12_4_ = auVar127._12_4_ + auVar102._12_4_;
          auVar86._16_4_ = auVar127._16_4_ + auVar102._16_4_;
          auVar86._20_4_ = auVar127._20_4_ + auVar102._20_4_;
          auVar86._24_4_ = auVar127._24_4_ + auVar102._24_4_;
          auVar86._28_4_ = auVar127._28_4_ + auVar102._28_4_;
          auVar132 = vsubps_avx(auVar85,auVar129);
          auVar110._0_4_ = auVar85._0_4_ + auVar129._0_4_;
          auVar110._4_4_ = auVar85._4_4_ + auVar129._4_4_;
          auVar110._8_4_ = auVar85._8_4_ + auVar129._8_4_;
          auVar110._12_4_ = auVar85._12_4_ + auVar129._12_4_;
          auVar110._16_4_ = auVar85._16_4_ + auVar129._16_4_;
          auVar110._20_4_ = auVar85._20_4_ + auVar129._20_4_;
          auVar110._24_4_ = auVar85._24_4_ + auVar129._24_4_;
          auVar110._28_4_ = auVar85._28_4_ + auVar129._28_4_;
          auVar129 = vsubps_avx(auVar128,auVar123);
          auVar73._0_4_ = auVar128._0_4_ + auVar123._0_4_;
          auVar73._4_4_ = auVar128._4_4_ + auVar123._4_4_;
          auVar73._8_4_ = auVar128._8_4_ + auVar123._8_4_;
          auVar73._12_4_ = auVar128._12_4_ + auVar123._12_4_;
          auVar73._16_4_ = auVar128._16_4_ + auVar123._16_4_;
          auVar73._20_4_ = auVar128._20_4_ + auVar123._20_4_;
          auVar73._24_4_ = auVar128._24_4_ + auVar123._24_4_;
          auVar73._28_4_ = auVar128._28_4_ + auVar123._28_4_;
          auVar124._0_4_ = auVar129._0_4_ * auVar110._0_4_;
          auVar124._4_4_ = auVar129._4_4_ * auVar110._4_4_;
          auVar124._8_4_ = auVar129._8_4_ * auVar110._8_4_;
          auVar124._12_4_ = auVar129._12_4_ * auVar110._12_4_;
          auVar124._16_4_ = auVar129._16_4_ * auVar110._16_4_;
          auVar124._20_4_ = auVar129._20_4_ * auVar110._20_4_;
          auVar124._24_4_ = auVar129._24_4_ * auVar110._24_4_;
          auVar124._28_4_ = 0;
          auVar99 = vfmsub231ps_fma(auVar124,auVar132,auVar73);
          auVar31._4_4_ = auVar73._4_4_ * auVar135._4_4_;
          auVar31._0_4_ = auVar73._0_4_ * auVar135._0_4_;
          auVar31._8_4_ = auVar73._8_4_ * auVar135._8_4_;
          auVar31._12_4_ = auVar73._12_4_ * auVar135._12_4_;
          auVar31._16_4_ = auVar73._16_4_ * auVar135._16_4_;
          auVar31._20_4_ = auVar73._20_4_ * auVar135._20_4_;
          auVar31._24_4_ = auVar73._24_4_ * auVar135._24_4_;
          auVar31._28_4_ = auVar73._28_4_;
          auVar92 = vfmsub231ps_fma(auVar31,auVar129,auVar86);
          auVar32._4_4_ = auVar132._4_4_ * auVar86._4_4_;
          auVar32._0_4_ = auVar132._0_4_ * auVar86._0_4_;
          auVar32._8_4_ = auVar132._8_4_ * auVar86._8_4_;
          auVar32._12_4_ = auVar132._12_4_ * auVar86._12_4_;
          auVar32._16_4_ = auVar132._16_4_ * auVar86._16_4_;
          auVar32._20_4_ = auVar132._20_4_ * auVar86._20_4_;
          auVar32._24_4_ = auVar132._24_4_ * auVar86._24_4_;
          auVar32._28_4_ = auVar86._28_4_;
          auVar106 = vfmsub231ps_fma(auVar32,auVar135,auVar110);
          local_13c0._0_4_ = local_13c0._4_4_;
          fStack_13b8 = local_13c0._4_4_;
          fStack_13b4 = local_13c0._4_4_;
          fStack_13b0 = local_13c0._4_4_;
          fStack_13ac = local_13c0._4_4_;
          fStack_13a8 = local_13c0._4_4_;
          fStack_13a4 = local_13c0._4_4_;
          auVar87._0_4_ = local_13c0._4_4_ * auVar106._0_4_;
          auVar87._4_4_ = local_13c0._4_4_ * auVar106._4_4_;
          auVar87._8_4_ = local_13c0._4_4_ * auVar106._8_4_;
          auVar87._12_4_ = local_13c0._4_4_ * auVar106._12_4_;
          auVar87._16_4_ = local_13c0._4_4_ * 0.0;
          auVar87._20_4_ = local_13c0._4_4_ * 0.0;
          auVar87._24_4_ = local_13c0._4_4_ * 0.0;
          auVar87._28_4_ = 0;
          auVar92 = vfmadd231ps_fma(auVar87,local_1460._0_32_,ZEXT1632(auVar92));
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar165,ZEXT1632(auVar99));
          auVar72._0_8_ =
               CONCAT44(auVar92._4_4_ + auVar97._4_4_ + auVar83._4_4_,
                        auVar92._0_4_ + auVar97._0_4_ + auVar83._0_4_);
          auVar72._8_4_ = auVar92._8_4_ + auVar97._8_4_ + auVar83._8_4_;
          auVar72._12_4_ = auVar92._12_4_ + auVar97._12_4_ + auVar83._12_4_;
          auVar131._8_4_ = 0x7fffffff;
          auVar131._0_8_ = 0x7fffffff7fffffff;
          auVar131._12_4_ = 0x7fffffff;
          auVar131._16_4_ = 0x7fffffff;
          auVar131._20_4_ = 0x7fffffff;
          auVar131._24_4_ = 0x7fffffff;
          auVar131._28_4_ = 0x7fffffff;
          local_13e0 = ZEXT1632(auVar72);
          auVar123 = local_13e0;
          auVar127 = vandps_avx(ZEXT1632(auVar72),auVar131);
          fVar71 = auVar127._0_4_ * 1.1920929e-07;
          fVar76 = auVar127._4_4_ * 1.1920929e-07;
          auVar33._4_4_ = fVar76;
          auVar33._0_4_ = fVar71;
          fVar77 = auVar127._8_4_ * 1.1920929e-07;
          auVar33._8_4_ = fVar77;
          fVar78 = auVar127._12_4_ * 1.1920929e-07;
          auVar33._12_4_ = fVar78;
          fVar79 = auVar127._16_4_ * 1.1920929e-07;
          auVar33._16_4_ = fVar79;
          fVar80 = auVar127._20_4_ * 1.1920929e-07;
          auVar33._20_4_ = fVar80;
          fVar81 = auVar127._24_4_ * 1.1920929e-07;
          auVar33._24_4_ = fVar81;
          auVar33._28_4_ = auVar127._28_4_;
          auVar96 = ZEXT1632(auVar97);
          auVar85 = vminps_avx(auVar96,ZEXT1632(auVar83));
          auVar85 = vminps_avx(auVar85,ZEXT1632(auVar92));
          auVar125._0_8_ = CONCAT44(fVar76,fVar71) ^ 0x8000000080000000;
          auVar125._8_4_ = -fVar77;
          auVar125._12_4_ = -fVar78;
          auVar125._16_4_ = -fVar79;
          auVar125._20_4_ = -fVar80;
          auVar125._24_4_ = -fVar81;
          auVar125._28_4_ = auVar127._28_4_ ^ 0x80000000;
          auVar127 = vcmpps_avx(auVar85,auVar125,5);
          auVar128 = vmaxps_avx(auVar96,ZEXT1632(auVar83));
          auVar102 = vmaxps_avx(auVar128,ZEXT1632(auVar92));
          auVar85 = vcmpps_avx(auVar102,auVar33,2);
          local_1000 = vorps_avx(auVar127,auVar85);
          local_12a8 = (undefined1 (*) [16])(lVar55 + 0x2c + uVar66 * 0xc);
          uVar3 = *(uint *)(local_1470 + 0x18);
          auVar62 = (undefined1  [8])CONCAT44(0,uVar3);
          uVar65 = *(uint *)(local_1470 + 0x1c);
          local_1140 = &local_12a8;
          auVar15._8_8_ = local_1060[1]._8_8_;
          auVar15._0_8_ = local_1060[1]._0_8_;
          auVar15._16_8_ = local_1060[1]._16_8_;
          auVar15._24_8_ = local_1060[1]._24_8_;
          auVar15 = auVar15 & local_1000;
          if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar15 >> 0x7f,0) != '\0') ||
                (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0xbf,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar15[0x1f] < '\0') {
            local_1020 = 0x80000000;
            uStack_101c = 0x80000000;
            uStack_1018 = 0x80000000;
            uStack_1014 = 0x80000000;
            uStack_1010 = 0x80000000;
            uStack_100c = 0x80000000;
            uStack_1008 = 0x80000000;
            uStack_1004 = 0x80000000;
            auVar34._4_4_ = local_1340._4_4_ * fVar144;
            auVar34._0_4_ = local_1340._0_4_ * fVar140;
            auVar34._8_4_ = local_1340._8_4_ * fVar145;
            auVar34._12_4_ = local_1340._12_4_ * fVar146;
            auVar34._16_4_ = local_1340._16_4_ * fVar147;
            auVar34._20_4_ = local_1340._20_4_ * fVar148;
            auVar34._24_4_ = local_1340._24_4_ * fVar149;
            auVar34._28_4_ = local_1000._28_4_;
            auVar35._4_4_ = local_1360._4_4_ * fVar115;
            auVar35._0_4_ = local_1360._0_4_ * auVar91._0_4_;
            auVar35._8_4_ = local_1360._8_4_ * fVar6;
            auVar35._12_4_ = local_1360._12_4_ * fVar8;
            auVar35._16_4_ = local_1360._16_4_ * fVar10;
            auVar35._20_4_ = local_1360._20_4_ * fVar12;
            auVar35._24_4_ = local_1360._24_4_ * fVar14;
            auVar35._28_4_ = auVar102._28_4_;
            auVar92 = vfmsub213ps_fma(_local_1360,local_fc0,auVar34);
            auVar36._4_4_ = fVar114 * auVar132._4_4_;
            auVar36._0_4_ = fVar113 * auVar132._0_4_;
            auVar36._8_4_ = fVar5 * auVar132._8_4_;
            auVar36._12_4_ = fVar7 * auVar132._12_4_;
            auVar36._16_4_ = fVar9 * auVar132._16_4_;
            auVar36._20_4_ = fVar11 * auVar132._20_4_;
            auVar36._24_4_ = fVar13 * auVar132._24_4_;
            auVar36._28_4_ = auVar127._28_4_;
            auVar37._4_4_ = fVar115 * auVar129._4_4_;
            auVar37._0_4_ = auVar91._0_4_ * auVar129._0_4_;
            auVar37._8_4_ = fVar6 * auVar129._8_4_;
            auVar37._12_4_ = fVar8 * auVar129._12_4_;
            auVar37._16_4_ = fVar10 * auVar129._16_4_;
            auVar37._20_4_ = fVar12 * auVar129._20_4_;
            auVar37._24_4_ = fVar14 * auVar129._24_4_;
            auVar37._28_4_ = auVar128._28_4_;
            auVar99 = vfmsub213ps_fma(auVar129,_local_1280,auVar36);
            auVar127 = vandps_avx(auVar34,auVar131);
            auVar85 = vandps_avx(auVar36,auVar131);
            auVar127 = vcmpps_avx(auVar127,auVar85,1);
            local_10a0 = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar92),auVar127);
            auVar38._4_4_ = fVar144 * auVar135._4_4_;
            auVar38._0_4_ = fVar140 * auVar135._0_4_;
            auVar38._8_4_ = fVar145 * auVar135._8_4_;
            auVar38._12_4_ = fVar146 * auVar135._12_4_;
            auVar38._16_4_ = fVar147 * auVar135._16_4_;
            auVar38._20_4_ = fVar148 * auVar135._20_4_;
            auVar38._24_4_ = fVar149 * auVar135._24_4_;
            auVar38._28_4_ = auVar85._28_4_;
            auVar92 = vfmsub213ps_fma(auVar135,local_fc0,auVar37);
            auVar39._4_4_ = local_1320._4_4_ * fVar114;
            auVar39._0_4_ = local_1320._0_4_ * fVar113;
            auVar39._8_4_ = local_1320._8_4_ * fVar5;
            auVar39._12_4_ = local_1320._12_4_ * fVar7;
            auVar39._16_4_ = local_1320._16_4_ * fVar9;
            auVar39._20_4_ = local_1320._20_4_ * fVar11;
            auVar39._24_4_ = local_1320._24_4_ * fVar13;
            auVar39._28_4_ = auVar127._28_4_;
            auVar99 = vfmsub213ps_fma(local_1340,local_fe0,auVar39);
            auVar127 = vandps_avx(auVar39,auVar131);
            auVar85 = vandps_avx(auVar37,auVar131);
            auVar127 = vcmpps_avx(auVar127,auVar85,1);
            local_1080 = vblendvps_avx(ZEXT1632(auVar92),ZEXT1632(auVar99),auVar127);
            auVar92 = vfmsub213ps_fma(local_1320,_local_1280,auVar35);
            auVar99 = vfmsub213ps_fma(auVar132,local_fe0,auVar38);
            auVar127 = vandps_avx(auVar35,auVar131);
            auVar85 = vandps_avx(auVar38,auVar131);
            auVar127 = vcmpps_avx(auVar127,auVar85,1);
            local_1060[0] = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar92),auVar127);
            auVar40._4_4_ = local_1060[0]._4_4_ * local_13c0._4_4_;
            auVar40._0_4_ = local_1060[0]._0_4_ * local_13c0._4_4_;
            auVar40._8_4_ = local_1060[0]._8_4_ * local_13c0._4_4_;
            auVar40._12_4_ = local_1060[0]._12_4_ * local_13c0._4_4_;
            auVar40._16_4_ = local_1060[0]._16_4_ * local_13c0._4_4_;
            auVar40._20_4_ = local_1060[0]._20_4_ * local_13c0._4_4_;
            auVar40._24_4_ = local_1060[0]._24_4_ * local_13c0._4_4_;
            auVar40._28_4_ = auVar85._28_4_;
            auVar92 = vfmadd213ps_fma(local_1460._0_32_,local_1080,auVar40);
            auVar92 = vfmadd213ps_fma(auVar165,local_10a0,ZEXT1632(auVar92));
            auVar91._0_4_ = auVar92._0_4_ + auVar92._0_4_;
            fVar113 = auVar92._4_4_ + auVar92._4_4_;
            fVar114 = auVar92._8_4_ + auVar92._8_4_;
            fVar115 = auVar92._12_4_ + auVar92._12_4_;
            auVar128 = ZEXT1632(CONCAT412(fVar115,CONCAT48(fVar114,CONCAT44(fVar113,auVar91._0_4_)))
                               );
            auVar41._4_4_ = local_1060[0]._4_4_ * fVar153;
            auVar41._0_4_ = local_1060[0]._0_4_ * fVar152;
            auVar41._8_4_ = local_1060[0]._8_4_ * fVar154;
            auVar41._12_4_ = local_1060[0]._12_4_ * auVar98._0_4_;
            auVar41._16_4_ = local_1060[0]._16_4_ * fVar160;
            auVar41._20_4_ = local_1060[0]._20_4_ * fVar161;
            auVar41._24_4_ = local_1060[0]._24_4_ * fVar162;
            auVar41._28_4_ = auVar85._28_4_;
            auVar92 = vfmadd213ps_fma(local_1300,local_1080,auVar41);
            auVar127 = vrcpps_avx(auVar128);
            auVar99 = vfmadd213ps_fma(_local_1400,local_10a0,ZEXT1632(auVar92));
            auVar151._8_4_ = 0x3f800000;
            auVar151._0_8_ = &DAT_3f8000003f800000;
            auVar151._12_4_ = 0x3f800000;
            auVar151._16_4_ = 0x3f800000;
            auVar151._20_4_ = 0x3f800000;
            auVar151._24_4_ = 0x3f800000;
            auVar151._28_4_ = 0x3f800000;
            auVar92 = vfnmadd213ps_fma(auVar127,auVar128,auVar151);
            auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar127,auVar127);
            local_10c0._28_4_ = auVar127._28_4_;
            local_10c0._0_28_ =
                 ZEXT1628(CONCAT412(auVar92._12_4_ * (auVar99._12_4_ + auVar99._12_4_),
                                    CONCAT48(auVar92._8_4_ * (auVar99._8_4_ + auVar99._8_4_),
                                             CONCAT44(auVar92._4_4_ *
                                                      (auVar99._4_4_ + auVar99._4_4_),
                                                      auVar92._0_4_ *
                                                      (auVar99._0_4_ + auVar99._0_4_)))));
            uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar126._4_4_ = uVar70;
            auVar126._0_4_ = uVar70;
            auVar126._8_4_ = uVar70;
            auVar126._12_4_ = uVar70;
            auVar126._16_4_ = uVar70;
            auVar126._20_4_ = uVar70;
            auVar126._24_4_ = uVar70;
            auVar126._28_4_ = uVar70;
            auVar127 = vcmpps_avx(auVar126,local_10c0,2);
            fVar152 = (ray->super_RayK<1>).tfar;
            auVar141._4_4_ = fVar152;
            auVar141._0_4_ = fVar152;
            auVar141._8_4_ = fVar152;
            auVar141._12_4_ = fVar152;
            auVar141._16_4_ = fVar152;
            auVar141._20_4_ = fVar152;
            auVar141._24_4_ = fVar152;
            auVar141._28_4_ = fVar152;
            auVar85 = vcmpps_avx(local_10c0,auVar141,2);
            auVar127 = vandps_avx(auVar85,auVar127);
            auVar142._0_8_ = CONCAT44(fVar113,auVar91._0_4_) ^ 0x8000000080000000;
            auVar142._8_4_ = -fVar114;
            auVar142._12_4_ = -fVar115;
            auVar142._16_4_ = 0x80000000;
            auVar142._20_4_ = 0x80000000;
            auVar142._24_4_ = 0x80000000;
            auVar142._28_4_ = 0x80000000;
            auVar85 = vcmpps_avx(auVar142,auVar128,4);
            auVar127 = vandps_avx(auVar85,auVar127);
            auVar51._8_8_ = local_1060[1]._8_8_;
            auVar51._0_8_ = local_1060[1]._0_8_;
            auVar51._16_8_ = local_1060[1]._16_8_;
            auVar51._24_8_ = local_1060[1]._24_8_;
            auVar85 = vandps_avx(local_1000,auVar51);
            auVar127 = vpslld_avx2(auVar127,0x1f);
            auVar128 = vpsrad_avx2(auVar127,0x1f);
            auVar127 = auVar85 & auVar128;
            if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar127 >> 0x7f,0) != '\0') ||
                  (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar127 >> 0xbf,0) != '\0') ||
                (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar127[0x1f] < '\0') {
              auVar127 = vandps_avx(auVar128,auVar85);
              local_11a0 = auVar96;
              local_1180 = ZEXT1632(auVar83);
              local_13e0._8_8_ = auVar72._8_8_;
              local_1160 = auVar72._0_8_;
              uStack_1158 = local_13e0._8_8_;
              uStack_1150 = 0;
              uStack_1148 = 0;
              local_1140 = &local_12a8;
              local_1120 = auVar127;
              pGVar56 = (local_1428->scene->geometries).items[(long)auVar62].ptr;
              if ((pGVar56->mask & (ray->super_RayK<1>).mask) != 0) {
                local_1460._0_8_ = pGVar56;
                local_1260 = auVar127;
                auVar102 = ZEXT1632(CONCAT88(local_13e0._8_8_,auVar72._0_8_));
                auVar128 = vrcpps_avx(auVar102);
                auVar85 = vandps_avx(auVar102,auVar131);
                auVar111._8_4_ = 0x219392ef;
                auVar111._0_8_ = 0x219392ef219392ef;
                auVar111._12_4_ = 0x219392ef;
                auVar111._16_4_ = 0x219392ef;
                auVar111._20_4_ = 0x219392ef;
                auVar111._24_4_ = 0x219392ef;
                auVar111._28_4_ = 0x219392ef;
                auVar85 = vcmpps_avx(auVar85,auVar111,5);
                auVar112._8_4_ = 0x3f800000;
                auVar112._0_8_ = &DAT_3f8000003f800000;
                auVar112._12_4_ = 0x3f800000;
                auVar112._16_4_ = 0x3f800000;
                auVar112._20_4_ = 0x3f800000;
                auVar112._24_4_ = 0x3f800000;
                auVar112._28_4_ = 0x3f800000;
                auVar92 = vfnmadd213ps_fma(auVar102,auVar128,auVar112);
                auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar128,auVar128);
                auVar85 = vandps_avx(auVar85,ZEXT1632(auVar92));
                auVar88._0_4_ = auVar85._0_4_ * auVar97._0_4_;
                auVar88._4_4_ = auVar85._4_4_ * auVar97._4_4_;
                auVar88._8_4_ = auVar85._8_4_ * auVar97._8_4_;
                auVar88._12_4_ = auVar85._12_4_ * auVar97._12_4_;
                auVar88._16_4_ = auVar85._16_4_ * 0.0;
                auVar88._20_4_ = auVar85._20_4_ * 0.0;
                auVar88._24_4_ = auVar85._24_4_ * 0.0;
                auVar88._28_4_ = 0;
                auVar128 = vminps_avx(auVar88,auVar112);
                auVar42._4_4_ = auVar85._4_4_ * auVar83._4_4_;
                auVar42._0_4_ = auVar85._0_4_ * auVar83._0_4_;
                auVar42._8_4_ = auVar85._8_4_ * auVar83._8_4_;
                auVar42._12_4_ = auVar85._12_4_ * auVar83._12_4_;
                auVar42._16_4_ = auVar85._16_4_ * 0.0;
                auVar42._20_4_ = auVar85._20_4_ * 0.0;
                auVar42._24_4_ = auVar85._24_4_ * 0.0;
                auVar42._28_4_ = auVar85._28_4_;
                auVar85 = vminps_avx(auVar42,auVar112);
                auVar97 = *(undefined1 (*) [16])(*local_12a8 + local_12a0 * 4);
                auVar83 = auVar97;
                if (2 < local_1298) {
                  auVar83 = *(undefined1 (*) [16])(*local_12a8 + local_12a0 * 8);
                }
                auVar92 = *local_12a8;
                if (local_12a0 == 2) {
                  auVar92 = vpshufd_avx(auVar92,0x54);
                  auVar97 = vpshufd_avx(auVar97,0x54);
                  auVar83 = vpshufd_avx(auVar83,0x54);
                }
                auVar122._0_16_ = ZEXT116(0) * auVar97 + ZEXT116(1) * auVar92;
                auVar122._16_16_ = ZEXT116(1) * auVar97;
                auVar105._0_16_ = ZEXT116(0) * auVar83 + ZEXT116(1) * auVar97;
                auVar105._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar83;
                auVar102 = vpunpckldq_avx2(auVar122,auVar105);
                auVar135 = vpshufd_avx2(auVar122,0xa5);
                auVar96 = vpshufd_avx2(auVar105,0x94);
                auVar129 = vpsrld_avx2(auVar102,0x10);
                auVar138 = ZEXT1232(ZEXT812(0)) << 0x20;
                auVar102 = vpblendw_avx2(auVar102,auVar138,0xaa);
                auVar102 = vcvtdq2ps_avx(auVar102);
                auVar129 = vcvtdq2ps_avx(auVar129);
                auVar132 = vpsrld_avx2(auVar135,0x10);
                auVar135 = vpblendw_avx2(auVar135,auVar138,0xaa);
                auVar135 = vcvtdq2ps_avx(auVar135);
                auVar132 = vcvtdq2ps_avx(auVar132);
                auVar138 = vpsrld_avx2(auVar96,0x10);
                auVar96 = vpblendw_avx2(auVar96,ZEXT1232(ZEXT812(0)) << 0x20,0xaa);
                auVar96 = vcvtdq2ps_avx(auVar96);
                auVar138 = vcvtdq2ps_avx(auVar138);
                auVar133._8_4_ = 0x3f800000;
                auVar133._0_8_ = &DAT_3f8000003f800000;
                auVar133._12_4_ = 0x3f800000;
                auVar133._16_4_ = 0x3f800000;
                auVar133._20_4_ = 0x3f800000;
                auVar133._24_4_ = 0x3f800000;
                auVar133._28_4_ = 0x3f800000;
                auVar15 = vsubps_avx(auVar133,auVar128);
                auVar15 = vsubps_avx(auVar15,auVar85);
                local_1100[1] =
                     auVar85._4_4_ * auVar96._4_4_ * 0.00012207031 +
                     auVar128._4_4_ * auVar135._4_4_ * 0.00012207031 +
                     auVar15._4_4_ * auVar102._4_4_ * 0.00012207031;
                local_1100[0] =
                     auVar85._0_4_ * auVar96._0_4_ * 0.00012207031 +
                     auVar128._0_4_ * auVar135._0_4_ * 0.00012207031 +
                     auVar15._0_4_ * auVar102._0_4_ * 0.00012207031;
                local_1100[2] =
                     auVar85._8_4_ * auVar96._8_4_ * 0.00012207031 +
                     auVar128._8_4_ * auVar135._8_4_ * 0.00012207031 +
                     auVar15._8_4_ * auVar102._8_4_ * 0.00012207031;
                local_1100[3] =
                     auVar85._12_4_ * auVar96._12_4_ * 0.00012207031 +
                     auVar128._12_4_ * auVar135._12_4_ * 0.00012207031 +
                     auVar15._12_4_ * auVar102._12_4_ * 0.00012207031;
                fStack_10f0 = auVar85._16_4_ * auVar96._16_4_ * 0.00012207031 +
                              auVar128._16_4_ * auVar135._16_4_ * 0.00012207031 +
                              auVar15._16_4_ * auVar102._16_4_ * 0.00012207031;
                fStack_10ec = auVar85._20_4_ * auVar96._20_4_ * 0.00012207031 +
                              auVar128._20_4_ * auVar135._20_4_ * 0.00012207031 +
                              auVar15._20_4_ * auVar102._20_4_ * 0.00012207031;
                fStack_10e8 = auVar85._24_4_ * auVar96._24_4_ * 0.00012207031 +
                              auVar128._24_4_ * auVar135._24_4_ * 0.00012207031 +
                              auVar15._24_4_ * auVar102._24_4_ * 0.00012207031;
                fStack_10e4 = auVar96._28_4_ + auVar135._28_4_ + auVar85._28_4_;
                local_10e0[1] =
                     auVar138._4_4_ * 0.00012207031 * auVar85._4_4_ +
                     auVar128._4_4_ * auVar132._4_4_ * 0.00012207031 +
                     auVar15._4_4_ * auVar129._4_4_ * 0.00012207031;
                local_10e0[0] =
                     auVar138._0_4_ * 0.00012207031 * auVar85._0_4_ +
                     auVar128._0_4_ * auVar132._0_4_ * 0.00012207031 +
                     auVar15._0_4_ * auVar129._0_4_ * 0.00012207031;
                local_10e0[2] =
                     auVar138._8_4_ * 0.00012207031 * auVar85._8_4_ +
                     auVar128._8_4_ * auVar132._8_4_ * 0.00012207031 +
                     auVar15._8_4_ * auVar129._8_4_ * 0.00012207031;
                local_10e0[3] =
                     auVar138._12_4_ * 0.00012207031 * auVar85._12_4_ +
                     auVar128._12_4_ * auVar132._12_4_ * 0.00012207031 +
                     auVar15._12_4_ * auVar129._12_4_ * 0.00012207031;
                fStack_10d0 = auVar138._16_4_ * 0.00012207031 * auVar85._16_4_ +
                              auVar128._16_4_ * auVar132._16_4_ * 0.00012207031 +
                              auVar15._16_4_ * auVar129._16_4_ * 0.00012207031;
                fStack_10cc = auVar138._20_4_ * 0.00012207031 * auVar85._20_4_ +
                              auVar128._20_4_ * auVar132._20_4_ * 0.00012207031 +
                              auVar15._20_4_ * auVar129._20_4_ * 0.00012207031;
                fStack_10c8 = auVar138._24_4_ * 0.00012207031 * auVar85._24_4_ +
                              auVar128._24_4_ * auVar132._24_4_ * 0.00012207031 +
                              auVar15._24_4_ * auVar129._24_4_ * 0.00012207031;
                fStack_10c4 = auVar135._28_4_ + auVar132._28_4_ + auVar15._28_4_;
                auVar75 = ZEXT3264(local_10c0);
                auVar89._8_4_ = 0x7f800000;
                auVar89._0_8_ = 0x7f8000007f800000;
                auVar89._12_4_ = 0x7f800000;
                auVar89._16_4_ = 0x7f800000;
                auVar89._20_4_ = 0x7f800000;
                auVar89._24_4_ = 0x7f800000;
                auVar89._28_4_ = 0x7f800000;
                auVar85 = vblendvps_avx(auVar89,local_10c0,auVar127);
                auVar128 = vshufps_avx(auVar85,auVar85,0xb1);
                auVar128 = vminps_avx(auVar85,auVar128);
                auVar102 = vshufpd_avx(auVar128,auVar128,5);
                auVar128 = vminps_avx(auVar128,auVar102);
                auVar102 = vpermpd_avx2(auVar128,0x4e);
                auVar128 = vminps_avx(auVar128,auVar102);
                auVar85 = vcmpps_avx(auVar85,auVar128,0);
                auVar128 = auVar127 & auVar85;
                if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar128 >> 0x7f,0) != '\0') ||
                      (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar128 >> 0xbf,0) != '\0') ||
                    (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar128[0x1f] < '\0') {
                  auVar127 = vandps_avx(auVar85,auVar127);
                }
                uVar53 = vmovmskps_avx(auVar127);
                uVar57 = 0;
                for (; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x80000000) {
                  uVar57 = uVar57 + 1;
                }
                uVar66 = (ulong)uVar57;
                if ((local_1428->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar56->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar152 = local_1100[uVar66];
                  fVar153 = local_10e0[uVar66];
                  fVar154 = *(float *)(local_10a0 + uVar66 * 4);
                  auVar98._0_4_ = *(float *)(local_1080 + uVar66 * 4);
                  fVar160 = *(float *)(local_1060[0] + uVar66 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_10c0 + uVar66 * 4);
                  (ray->Ng).field_0.field_0.x = fVar154;
                  (ray->Ng).field_0.field_0.y = auVar98._0_4_;
                  (ray->Ng).field_0.field_0.z = fVar160;
                  ray->u = fVar152;
                  ray->v = fVar153;
                  ray->primID = uVar65;
                  ray->geomID = uVar3;
                  pRVar4 = local_1428->user;
                  ray->instID[0] = pRVar4->instID[0];
                  ray->instPrimID[0] = pRVar4->instPrimID[0];
                }
                else {
                  local_1400 = (undefined1  [8])local_1428->args;
                  local_1300._0_8_ = local_1428->user;
                  local_1420 = auVar62;
                  local_1320._0_4_ = uVar65;
                  local_1340 = local_10c0;
                  local_13e0 = auVar123;
                  do {
                    local_12d4 = local_1100[uVar66];
                    local_12d0 = local_10e0[uVar66];
                    local_13e0._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_10c0 + uVar66 * 4);
                    local_13c0 = uVar66;
                    local_12e0 = *(float *)(local_10a0 + uVar66 * 4);
                    local_12dc = *(undefined4 *)(local_1080 + uVar66 * 4);
                    local_12d8 = *(undefined4 *)(local_1060[0] + uVar66 * 4);
                    local_12cc = uVar65;
                    local_12c8 = SUB84(auVar62,0);
                    local_12c4 = *(uint *)local_1300._0_8_;
                    local_12c0 = *(uint *)(local_1300._0_8_ + 4);
                    local_1464 = -1;
                    local_1390.valid = &local_1464;
                    local_1390.geometryUserPtr = pGVar56->userPtr;
                    local_1390.context = (RTCRayQueryContext *)local_1300._0_8_;
                    local_1390.ray = (RTCRayN *)ray;
                    local_1390.hit = (RTCHitN *)&local_12e0;
                    local_1390.N = 1;
                    if (pGVar56->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019ecca9:
                      if (*(code **)((long)local_1400 + 0x10) != (code *)0x0) {
                        if (((*(byte *)local_1400 & 2) != 0) ||
                           ((*(byte *)(local_1460._0_8_ + 0x3e) & 0x40) != 0)) {
                          (**(code **)((long)local_1400 + 0x10))(&local_1390);
                          auVar75 = ZEXT3264(local_1340);
                          auVar62 = local_1420;
                          uVar65 = local_1320._0_4_;
                        }
                        if (*local_1390.valid == 0) goto LAB_019ecd6f;
                      }
                      (((Vec3f *)((long)local_1390.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1390.hit;
                      (((Vec3f *)((long)local_1390.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1390.hit + 4);
                      (((Vec3f *)((long)local_1390.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1390.hit + 8);
                      *(float *)((long)local_1390.ray + 0x3c) = *(float *)(local_1390.hit + 0xc);
                      *(float *)((long)local_1390.ray + 0x40) = *(float *)(local_1390.hit + 0x10);
                      *(float *)((long)local_1390.ray + 0x44) = *(float *)(local_1390.hit + 0x14);
                      *(float *)((long)local_1390.ray + 0x48) = *(float *)(local_1390.hit + 0x18);
                      *(float *)((long)local_1390.ray + 0x4c) = *(float *)(local_1390.hit + 0x1c);
                      *(float *)((long)local_1390.ray + 0x50) = *(float *)(local_1390.hit + 0x20);
                    }
                    else {
                      (*pGVar56->intersectionFilterN)(&local_1390);
                      auVar75 = ZEXT3264(local_1340);
                      auVar62 = local_1420;
                      uVar65 = local_1320._0_4_;
                      if (*local_1390.valid != 0) goto LAB_019ecca9;
LAB_019ecd6f:
                      (ray->super_RayK<1>).tfar = (float)local_13e0._0_4_;
                    }
                    fVar152 = (ray->super_RayK<1>).tfar;
                    auVar74._4_4_ = fVar152;
                    auVar74._0_4_ = fVar152;
                    auVar74._8_4_ = fVar152;
                    auVar74._12_4_ = fVar152;
                    auVar74._16_4_ = fVar152;
                    auVar74._20_4_ = fVar152;
                    auVar74._24_4_ = fVar152;
                    auVar74._28_4_ = fVar152;
                    *(undefined4 *)(local_1260 + local_13c0 * 4) = 0;
                    auVar128 = local_1260;
                    auVar85 = vcmpps_avx(auVar75._0_32_,auVar74,2);
                    auVar127 = vandps_avx(auVar85,local_1260);
                    local_1260 = auVar127;
                    auVar128 = auVar128 & auVar85;
                    bVar49 = (auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar50 = (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar48 = (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar47 = SUB321(auVar128 >> 0x7f,0) != '\0';
                    bVar46 = (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar45 = SUB321(auVar128 >> 0xbf,0) != '\0';
                    bVar44 = (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar43 = auVar128[0x1f] < '\0';
                    uVar66 = local_13c0;
                    if (((((((bVar49 || bVar50) || bVar48) || bVar47) || bVar46) || bVar45) ||
                        bVar44) || bVar43) {
                      auVar90._8_4_ = 0x7f800000;
                      auVar90._0_8_ = 0x7f8000007f800000;
                      auVar90._12_4_ = 0x7f800000;
                      auVar90._16_4_ = 0x7f800000;
                      auVar90._20_4_ = 0x7f800000;
                      auVar90._24_4_ = 0x7f800000;
                      auVar90._28_4_ = 0x7f800000;
                      auVar85 = vblendvps_avx(auVar90,auVar75._0_32_,auVar127);
                      auVar128 = vshufps_avx(auVar85,auVar85,0xb1);
                      auVar128 = vminps_avx(auVar85,auVar128);
                      auVar102 = vshufpd_avx(auVar128,auVar128,5);
                      auVar128 = vminps_avx(auVar128,auVar102);
                      auVar102 = vpermpd_avx2(auVar128,0x4e);
                      auVar128 = vminps_avx(auVar128,auVar102);
                      auVar85 = vcmpps_avx(auVar85,auVar128,0);
                      auVar128 = auVar127 & auVar85;
                      if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar128 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar128 >> 0x7f,0) != '\0') ||
                            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar128 >> 0xbf,0) != '\0') ||
                          (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar128[0x1f] < '\0') {
                        auVar127 = vandps_avx(auVar85,auVar127);
                      }
                      uVar57 = vmovmskps_avx(auVar127);
                      uVar3 = 0;
                      for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
                        uVar3 = uVar3 + 1;
                      }
                      uVar66 = (ulong)uVar3;
                    }
                    pGVar56 = (Geometry *)local_1460._0_8_;
                  } while (((((((bVar49 || bVar50) || bVar48) || bVar47) || bVar46) || bVar45) ||
                           bVar44) || bVar43);
                }
              }
            }
          }
          lVar55 = 0;
          auVar134 = ZEXT1664(local_11b0);
          auVar139 = ZEXT1664(local_11c0);
          auVar143 = ZEXT1664(local_11d0);
          auVar155 = ZEXT1664(local_11f0);
          auVar157 = ZEXT1664(local_1200);
          auVar163 = ZEXT1664(local_1220);
          auVar166 = ZEXT1664(local_1230);
          auVar130 = ZEXT1664(local_1290);
          auVar98._0_4_ = local_11e0;
          fVar152 = fStack_11dc;
          fVar153 = fStack_11d8;
          fVar154 = fStack_11d4;
          auVar91._0_4_ = local_1210;
          fVar160 = fStack_120c;
          fVar161 = fStack_1208;
          fVar162 = fStack_1204;
        }
        else {
          local_1470 = *(long *)(uVar66 & 0xfffffffffffffff0);
          fVar114 = (float)(*(int *)(local_1470 + 8) - 1);
          fVar113 = fVar114 * (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar97 = vroundss_avx(ZEXT416((uint)fVar113),ZEXT416((uint)fVar113),9);
          auVar97 = vminss_avx(auVar97,ZEXT416((uint)(fVar114 + -1.0)));
          auVar97 = vmaxss_avx(ZEXT816(0) << 0x20,auVar97);
          local_1468 = (int)auVar97._0_4_;
          local_1240 = ZEXT416((uint)(fVar113 - auVar97._0_4_));
          lVar55 = *(long *)(local_1470 + 0x30 +
                            (ulong)*(uint *)(local_1470 + 0x2c) + (long)local_1468 * 8);
        }
        fVar113 = (ray->super_RayK<1>).tfar;
        auVar75 = ZEXT1664(CONCAT412(fVar113,CONCAT48(fVar113,CONCAT44(fVar113,fVar113))));
        if (lVar55 != 0) {
          *(long *)*pauVar68 = lVar55;
          *(undefined4 *)(*pauVar68 + 8) = 0;
          pauVar68 = pauVar68 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }